

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluVarTypeUtil.hpp
# Opt level: O3

SubTypeIterator<glu::IsBasicType> * __thiscall
glu::SubTypeIterator<glu::IsBasicType>::operator++(SubTypeIterator<glu::IsBasicType> *this)

{
  if (((this->m_path).
       super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>._M_impl.
       super__Vector_impl_data._M_start !=
       (this->m_path).
       super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>._M_impl.
       super__Vector_impl_data._M_finish) &&
     (removeTraversed(this),
     (this->m_path).
     super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>._M_impl.
     super__Vector_impl_data._M_start !=
     (this->m_path).
     super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>._M_impl.
     super__Vector_impl_data._M_finish)) {
    findNext(this);
    return this;
  }
  this->m_type = (VarType *)0x0;
  return this;
}

Assistant:

SubTypeIterator<IsExpanded>& SubTypeIterator<IsExpanded>::operator++ (void)
{
	if (!m_path.empty())
	{
		// Remove traversed nodes.
		removeTraversed();

		if (!m_path.empty())
			findNext();
		else
			m_type = DE_NULL; // Unset type to signal end.
	}
	else
	{
		// First type was already expanded.
		DE_ASSERT(IsExpanded()(getVarType(*m_type, m_path)));
		m_type = DE_NULL;
	}

	return *this;
}